

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

bool Js::InlinedFrameWalker::FromPhysicalFrame
               (InlinedFrameWalker *self,StackFrame *physicalFrame,ScriptFunction *parent,
               bool fromBailout,int loopNum,JavascriptStackWalker *stackWalker,
               bool useInternalFrameInfo,bool noAlloc)

{
  code *pcVar1;
  InlineeFrameRecord *outerMostFrame_00;
  bool bVar2;
  FunctionBody *pFVar3;
  undefined4 *puVar4;
  InlineeFrameRecord *this;
  JavascriptCallStackLayout *callstack;
  Memory *this_00;
  int local_12c;
  int index;
  TrackAllocData local_118;
  InlinedFrame **local_f0;
  InlinedFrame **frames;
  InlinedFrame *frameIterator;
  InlineeFrameRecord *pIStack_d8;
  int32 frameCount;
  InlineeFrameRecord *record;
  InlinedFrame *outerMostFrame;
  void *entry;
  InternalFrameInfo lastInternalFrameInfo;
  void *local_60;
  void *framePointer;
  void *nativeCodeAddress;
  EntryPointInfo *entryPointInfo;
  FunctionBody *parentFunctionBody;
  bool inlinedFramesFound;
  bool noAlloc_local;
  bool useInternalFrameInfo_local;
  JavascriptStackWalker *stackWalker_local;
  int loopNum_local;
  bool fromBailout_local;
  ScriptFunction *parent_local;
  StackFrame *physicalFrame_local;
  InlinedFrameWalker *self_local;
  
  self_local._7_1_ = false;
  pFVar3 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
  if ((loopNum != -1) && (stackWalker == (JavascriptStackWalker *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4ee,"(stackWalker)","stackWalker");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((loopNum == -1) || (!useInternalFrameInfo)) {
    framePointer = Amd64StackFrame::GetInstructionPointer(physicalFrame);
    local_60 = Amd64StackFrame::GetFrame(physicalFrame);
  }
  else {
    JavascriptStackWalker::GetCachedInternalFrameInfo
              ((InternalFrameInfo *)&lastInternalFrameInfo.hasInlinedFramesOnStack,stackWalker);
    if (lastInternalFrameInfo._40_8_ == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x4f5,
                                  "(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr)"
                                  ,
                                  "stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    JavascriptStackWalker::GetCachedInternalFrameInfo((InternalFrameInfo *)&entry,stackWalker);
    framePointer = entry;
    local_60 = lastInternalFrameInfo.codeAddress;
  }
  if (loopNum == -1) {
    nativeCodeAddress = FunctionBody::GetEntryPointFromNativeAddress(pFVar3,(DWORD_PTR)framePointer)
    ;
  }
  else {
    nativeCodeAddress =
         FunctionBody::GetLoopEntryPointInfoFromNativeAddress
                   (pFVar3,(DWORD_PTR)framePointer,loopNum);
  }
  if (nativeCodeAddress == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x50a,"(entryPointInfo != nullptr)",
                                "Inlined frame should resolve to the right parent address");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = EntryPointInfo::HasInlinees((EntryPointInfo *)nativeCodeAddress);
  if (bVar2) {
    outerMostFrame =
         (InlinedFrame *)EntryPointInfo::GetNativeAddress((EntryPointInfo *)nativeCodeAddress);
    record = (InlineeFrameRecord *)
             InlinedFrame::FromPhysicalFrame
                       (physicalFrame,stackWalker,outerMostFrame,(EntryPointInfo *)nativeCodeAddress
                        ,useInternalFrameInfo);
    if (record == (InlineeFrameRecord *)0x0) {
      self_local._7_1_ = false;
    }
    else {
      if ((!fromBailout) &&
         (this = EntryPointInfo::FindInlineeFrame((EntryPointInfo *)nativeCodeAddress,framePointer),
         pIStack_d8 = this, this != (InlineeFrameRecord *)0x0)) {
        pFVar3 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)parent);
        outerMostFrame_00 = record;
        callstack = JavascriptCallStackLayout::FromFramePointer(local_60);
        InlineeFrameRecord::RestoreFrames
                  (this,pFVar3,(InlinedFrameLayout *)outerMostFrame_00,callstack,false);
      }
      if ((record->functionOffset & 0xfU) != 0) {
        self_local._7_1_ = true;
        if (noAlloc) {
          self_local._7_1_ = true;
        }
        else {
          frameIterator._4_4_ = 0;
          for (frames = (InlinedFrame **)record; ((ulong)*frames & 0xf) != 0;
              frames = (InlinedFrame **)InlinedFrame::Next((InlinedFrame *)frames)) {
            frameIterator._4_4_ = frameIterator._4_4_ + 1;
          }
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_118,(type_info *)&InlinedFrame*::typeinfo,0,(long)frameIterator._4_4_,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                     ,0x52e);
          this_00 = (Memory *)
                    Memory::HeapAllocator::TrackAllocInfo
                              (&Memory::HeapAllocator::Instance,&local_118);
          local_f0 = Memory::
                     AllocateArray<Memory::HeapAllocator,Js::InlinedFrameWalker::InlinedFrame*,false>
                               (this_00,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                                (long)frameIterator._4_4_);
          frames = (InlinedFrame **)record;
          local_12c = frameIterator._4_4_;
          while (local_12c = local_12c + -1, -1 < local_12c) {
            if (frames == (InlinedFrame **)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                          ,0x533,"(frameIterator)","frameIterator");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            local_f0[local_12c] = (InlinedFrame *)frames;
            frames = (InlinedFrame **)InlinedFrame::Next((InlinedFrame *)frames);
          }
          Initialize(self,frameIterator._4_4_,local_f0,parent);
        }
      }
    }
  }
  return self_local._7_1_;
}

Assistant:

bool InlinedFrameWalker::FromPhysicalFrame(InlinedFrameWalker& self, StackFrame& physicalFrame, Js::ScriptFunction *parent, bool fromBailout,
        int loopNum, const JavascriptStackWalker * const stackWalker, bool useInternalFrameInfo, bool noAlloc)
    {
        bool inlinedFramesFound = false;
        FunctionBody* parentFunctionBody = parent->GetFunctionBody();
        EntryPointInfo *entryPointInfo;

        if (loopNum != -1)
        {
            Assert(stackWalker);
        }

        void *nativeCodeAddress = nullptr;
        void *framePointer = nullptr;
        if (loopNum != -1 && useInternalFrameInfo)
        {
            Assert(stackWalker->GetCachedInternalFrameInfo().codeAddress != nullptr);
            InternalFrameInfo lastInternalFrameInfo = stackWalker->GetCachedInternalFrameInfo();

            nativeCodeAddress = lastInternalFrameInfo.codeAddress;
            framePointer = lastInternalFrameInfo.framePointer;
        }
        else
        {
            nativeCodeAddress = physicalFrame.GetInstructionPointer();
            framePointer = physicalFrame.GetFrame();
        }

        if (loopNum != -1)
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetLoopEntryPointInfoFromNativeAddress((DWORD_PTR)nativeCodeAddress, loopNum);
        }
        else
        {
            entryPointInfo = (Js::EntryPointInfo*)parentFunctionBody->GetEntryPointFromNativeAddress((DWORD_PTR)nativeCodeAddress);
        }

        AssertMsg(entryPointInfo != nullptr, "Inlined frame should resolve to the right parent address");
        if (entryPointInfo->HasInlinees())
        {
            void *entry = reinterpret_cast<void*>(entryPointInfo->GetNativeAddress());
            InlinedFrameWalker::InlinedFrame *outerMostFrame = InlinedFrame::FromPhysicalFrame(physicalFrame, stackWalker, entry, entryPointInfo, useInternalFrameInfo);

            if (!outerMostFrame)
            {
                return inlinedFramesFound;
            }

            if (!fromBailout)
            {
                InlineeFrameRecord* record = entryPointInfo->FindInlineeFrame((void*)nativeCodeAddress);

                if (record)
                {
                    record->RestoreFrames(parent->GetFunctionBody(), outerMostFrame, JavascriptCallStackLayout::FromFramePointer(framePointer), false /* boxValues */);
                }
            }

            if (outerMostFrame->callInfo.Count)
            {
                inlinedFramesFound = true;
                if (noAlloc)
                {
                    return inlinedFramesFound;
                }
                int32 frameCount = 0;
                InlinedFrameWalker::InlinedFrame *frameIterator = outerMostFrame;
                while (frameIterator->callInfo.Count)
                {
                    frameCount++;
                    frameIterator = frameIterator->Next();
                }

                InlinedFrameWalker::InlinedFrame **frames = HeapNewArray(InlinedFrameWalker::InlinedFrame*, frameCount);

                frameIterator = outerMostFrame;
                for (int index = frameCount - 1; index >= 0; index--)
                {
                    Assert(frameIterator);
                    frames[index] = frameIterator;
                    frameIterator = frameIterator->Next();
                }

                self.Initialize(frameCount, frames, parent);
            }

        }

        return inlinedFramesFound;
    }